

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

bool __thiscall
Catch::SectionTracking::TestCaseTracker::enterSection(TestCaseTracker *this,string *name)

{
  RunState RVar1;
  TrackedSection *this_00;
  TrackedSection *child;
  string *name_local;
  TestCaseTracker *this_local;
  
  if ((this->m_completedASectionThisRun & 1U) == 0) {
    RVar1 = TrackedSection::runState(this->m_currentSection);
    if (RVar1 == Executing) {
      TrackedSection::addChild(this->m_currentSection,name);
      this_local._7_1_ = false;
    }
    else {
      this_00 = TrackedSection::getChild(this->m_currentSection,name);
      RVar1 = TrackedSection::runState(this_00);
      if (RVar1 == Completed) {
        this_local._7_1_ = false;
      }
      else {
        this->m_currentSection = this_00;
        TrackedSection::enter(this->m_currentSection);
        this_local._7_1_ = true;
      }
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool enterSection( std::string const& name ) {
            if( m_completedASectionThisRun )
                return false;
            if( m_currentSection->runState() == TrackedSection::Executing ) {
                m_currentSection->addChild( name );
                return false;
            }
            else {
                TrackedSection* child = m_currentSection->getChild( name );
                if( child->runState() != TrackedSection::Completed ) {
                    m_currentSection = child;
                    m_currentSection->enter();
                    return true;
                }
                return false;
            }
        }